

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSyncTests.cpp
# Opt level: O2

int __thiscall deqp::egl::ReusableSyncTests::init(ReusableSyncTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestCaseGroup *pTVar1;
  TestNode *pTVar2;
  
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"valid","Valid function calls");
  pTVar2 = (TestNode *)operator_new(0x1ae0);
  egl::anon_unknown_0::CreateNullAttribsTest::CreateNullAttribsTest
            ((CreateNullAttribsTest *)pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa);
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x1ae0);
  egl::anon_unknown_0::CreateEmptyAttribsTest::CreateEmptyAttribsTest
            ((CreateEmptyAttribsTest *)pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa);
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x1ae0);
  egl::anon_unknown_0::ClientWaitNoTimeoutTest::ClientWaitNoTimeoutTest
            ((ClientWaitNoTimeoutTest *)pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa);
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x1ae0);
  egl::anon_unknown_0::ClientWaitForeverTest::ClientWaitForeverTest
            ((ClientWaitForeverTest *)pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa);
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x1ae0);
  egl::anon_unknown_0::ClientWaitNoContextTest::ClientWaitNoContextTest
            ((ClientWaitNoContextTest *)pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa);
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x1ae0);
  egl::anon_unknown_0::ClientWaitForeverFlushTest::ClientWaitForeverFlushTest
            ((ClientWaitForeverFlushTest *)pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa);
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x1ae0);
  egl::anon_unknown_0::GetSyncTypeTest::GetSyncTypeTest
            ((GetSyncTypeTest *)pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa);
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x1ae0);
  egl::anon_unknown_0::GetSyncStatusTest::GetSyncStatusTest
            ((GetSyncStatusTest *)pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa);
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x1ae0);
  egl::anon_unknown_0::GetSyncStatusSignaledTest::GetSyncStatusSignaledTest
            ((GetSyncStatusSignaledTest *)pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa);
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x1ae0);
  egl::anon_unknown_0::DestroySyncTest::DestroySyncTest
            ((DestroySyncTest *)pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa);
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x1ae0);
  egl::anon_unknown_0::WaitSyncTest::WaitSyncTest
            ((WaitSyncTest *)pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa);
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"invalid","Invalid function calls");
  pTVar2 = (TestNode *)operator_new(0x1ae0);
  egl::anon_unknown_0::CreateInvalidDisplayTest::CreateInvalidDisplayTest
            ((CreateInvalidDisplayTest *)pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa);
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x1ae0);
  egl::anon_unknown_0::CreateInvalidTypeTest::CreateInvalidTypeTest
            ((CreateInvalidTypeTest *)pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa);
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x1ae0);
  egl::anon_unknown_0::CreateInvalidAttribsTest::CreateInvalidAttribsTest
            ((CreateInvalidAttribsTest *)pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa);
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x1ae0);
  egl::anon_unknown_0::ClientWaitInvalidDisplayTest::ClientWaitInvalidDisplayTest
            ((ClientWaitInvalidDisplayTest *)pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa)
  ;
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x1ae0);
  egl::anon_unknown_0::ClientWaitInvalidSyncTest::ClientWaitInvalidSyncTest
            ((ClientWaitInvalidSyncTest *)pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa);
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x1ae0);
  egl::anon_unknown_0::GetSyncInvalidDisplayTest::GetSyncInvalidDisplayTest
            ((GetSyncInvalidDisplayTest *)pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa);
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x1ae0);
  egl::anon_unknown_0::GetSyncInvalidSyncTest::GetSyncInvalidSyncTest
            ((GetSyncInvalidSyncTest *)pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa);
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x1ae0);
  egl::anon_unknown_0::GetSyncInvalidAttributeTest::GetSyncInvalidAttributeTest
            ((GetSyncInvalidAttributeTest *)pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa);
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x1ae0);
  egl::anon_unknown_0::GetSyncInvalidValueTest::GetSyncInvalidValueTest
            ((GetSyncInvalidValueTest *)pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa);
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x1ae0);
  egl::anon_unknown_0::DestroySyncInvalidDislayTest::DestroySyncInvalidDislayTest
            ((DestroySyncInvalidDislayTest *)pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa)
  ;
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x1ae0);
  egl::anon_unknown_0::DestroySyncInvalidSyncTest::DestroySyncInvalidSyncTest
            ((DestroySyncInvalidSyncTest *)pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa);
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x1ae0);
  egl::anon_unknown_0::WaitSyncInvalidDisplayTest::WaitSyncInvalidDisplayTest
            ((WaitSyncInvalidDisplayTest *)pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa);
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x1ae0);
  egl::anon_unknown_0::WaitSyncInvalidSyncTest::WaitSyncInvalidSyncTest
            ((WaitSyncInvalidSyncTest *)pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa);
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x1ae0);
  egl::anon_unknown_0::WaitSyncInvalidFlagTest::WaitSyncInvalidFlagTest
            ((WaitSyncInvalidFlagTest *)pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30fa);
  tcu::TestNode::addChild((TestNode *)pTVar1,pTVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  return extraout_EAX;
}

Assistant:

void ReusableSyncTests::init (void)
{
	// Add valid API test
	{
		TestCaseGroup* const valid = new TestCaseGroup(m_eglTestCtx, "valid", "Valid function calls");

		// eglCreateSyncKHR tests
		valid->addChild(new CreateNullAttribsTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));
		valid->addChild(new CreateEmptyAttribsTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));

		// eglClientWaitSyncKHR tests
		valid->addChild(new ClientWaitNoTimeoutTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));
		valid->addChild(new ClientWaitForeverTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));
		valid->addChild(new ClientWaitNoContextTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));
		valid->addChild(new ClientWaitForeverFlushTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));

		// eglGetSyncAttribKHR tests
		valid->addChild(new GetSyncTypeTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));
		valid->addChild(new GetSyncStatusTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));
		valid->addChild(new GetSyncStatusSignaledTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));

		// eglDestroySyncKHR tests
		valid->addChild(new DestroySyncTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));

		// eglWaitSyncKHR tests
		valid->addChild(new WaitSyncTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));

		addChild(valid);
	}

	// Add negative API tests
	{
		TestCaseGroup* const invalid = new TestCaseGroup(m_eglTestCtx, "invalid", "Invalid function calls");

		// eglCreateSyncKHR tests
		invalid->addChild(new CreateInvalidDisplayTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));
		invalid->addChild(new CreateInvalidTypeTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));
		invalid->addChild(new CreateInvalidAttribsTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));

		// eglClientWaitSyncKHR tests
		invalid->addChild(new ClientWaitInvalidDisplayTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));
		invalid->addChild(new ClientWaitInvalidSyncTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));

		// eglGetSyncAttribKHR tests
		invalid->addChild(new GetSyncInvalidDisplayTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));
		invalid->addChild(new GetSyncInvalidSyncTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));
		invalid->addChild(new GetSyncInvalidAttributeTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));
		invalid->addChild(new GetSyncInvalidValueTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));

		// eglDestroySyncKHR tests
		invalid->addChild(new DestroySyncInvalidDislayTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));
		invalid->addChild(new DestroySyncInvalidSyncTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));

		// eglWaitSyncKHR tests
		invalid->addChild(new WaitSyncInvalidDisplayTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));
		invalid->addChild(new WaitSyncInvalidSyncTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));
		invalid->addChild(new WaitSyncInvalidFlagTest(m_eglTestCtx, EGL_SYNC_REUSABLE_KHR));

		addChild(invalid);
	}
}